

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

GLuint __thiscall CMU462::OSDText::compile_shaders(OSDText *this)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  allocator_type local_61;
  int info_length;
  GLint result;
  vector<char,_std::allocator<char>_> vert_shader_errmsg;
  char *frag_shader_src;
  char *vert_shader_src;
  
  GVar1 = (*__glewCreateShader)(0x8b31);
  GVar2 = (*__glewCreateShader)(0x8b30);
  vert_shader_src =
       "#version 120\nattribute vec4 coord;\nvarying vec2 texpos;\nvoid main(void) {\n  gl_Position = vec4(coord.xy, 0, 1);\n  texpos = coord.zw;\n}"
  ;
  frag_shader_src =
       "#version 120\nvarying vec2 texpos;\nuniform sampler2D tex;\nuniform vec4 color;\nvoid main(void) {\n  gl_FragColor = vec4(1, 1, 1, texture2D(tex, texpos).a) * color;\n}"
  ;
  result = 0;
  (*__glewShaderSource)(GVar1,1,&vert_shader_src,(GLint *)0x0);
  (*__glewCompileShader)(GVar1);
  (*__glewGetShaderiv)(GVar1,0x8b81,&result);
  (*__glewGetShaderiv)(GVar1,0x8b84,&info_length);
  if (0 < info_length) {
    std::vector<char,_std::allocator<char>_>::vector
              (&vert_shader_errmsg,(ulong)(uint)info_length + 1,&local_61);
    (*__glewGetShaderInfoLog)
              (GVar1,info_length,(GLsizei *)0x0,
               vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    puts(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>);
  }
  (*__glewShaderSource)(GVar2,1,&frag_shader_src,(GLint *)0x0);
  (*__glewCompileShader)(GVar2);
  (*__glewGetShaderiv)(GVar2,0x8b81,&result);
  (*__glewGetShaderiv)(GVar2,0x8b84,&info_length);
  if (0 < info_length) {
    std::vector<char,_std::allocator<char>_>::vector
              (&vert_shader_errmsg,(ulong)(uint)info_length + 1,&local_61);
    (*__glewGetShaderInfoLog)
              (GVar2,info_length,(GLsizei *)0x0,
               vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    puts(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>);
  }
  GVar3 = (*__glewCreateProgram)();
  (*__glewAttachShader)(GVar3,GVar1);
  (*__glewAttachShader)(GVar3,GVar2);
  (*__glewLinkProgram)(GVar3);
  (*__glewGetProgramiv)(GVar3,0x8b82,&result);
  (*__glewGetProgramiv)(GVar3,0x8b84,&info_length);
  if (0 < info_length) {
    std::vector<char,_std::allocator<char>_>::vector
              (&vert_shader_errmsg,(ulong)(uint)info_length + 1,&local_61);
    (*__glewGetProgramInfoLog)
              (GVar3,info_length,(GLsizei *)0x0,
               vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    puts(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>);
  }
  (*__glewDetachShader)(1,GVar1);
  (*__glewDetachShader)(1,GVar2);
  (*__glewDeleteShader)(GVar1);
  (*__glewDeleteShader)(GVar2);
  return GVar3;
}

Assistant:

GLuint OSDText::compile_shaders() {

  // create the shaders
  GLuint vert_shader = glCreateShader(GL_VERTEX_SHADER);
  GLuint frag_shader = glCreateShader(GL_FRAGMENT_SHADER);

  const char *vert_shader_src = "#version 120"
  "\nattribute vec4 coord;"
  "\nvarying vec2 texpos;"
  "\nvoid main(void) {"
  "\n  gl_Position = vec4(coord.xy, 0, 1);"
  "\n  texpos = coord.zw;"
  "\n}";

  const char *frag_shader_src = "#version 120"
  "\nvarying vec2 texpos;"
  "\nuniform sampler2D tex;"
  "\nuniform vec4 color;"
  "\nvoid main(void) {"
  "\n  gl_FragColor = vec4(1, 1, 1, texture2D(tex, texpos).a) * color;"
  "\n}";

// with drop shadow
//  "\nvarying vec2 texpos;"
//  "\nuniform sampler2D tex;"
//  "\nuniform vec4 color;"
//  "\n"
//  "\nconst float smoothing = 1.0/4.0;"
//  "\nconst vec2 shadowOffset = vec2(-1.0/512.0);"
//  "\nconst vec4 glowColor = vec4(vec3(0.1), 1.0);"
//  "\nconst float glowMin = 0.2;"
//  "\nconst float glowMax = 0.8;"
//  "\n"
//  "\n// drop shadow computed in fragment shader"
//  "\nvoid main() {"
//  "\n    vec4 texColor = texture2D(tex, texpos);"
//  "\n    float dst = texColor.a;"
//  "\n    float alpha = smoothstep(0.5 - smoothing, 0.5 + smoothing, dst);"
//  "\n"
//  "\n    float glowDst = texture2D(tex, texpos + shadowOffset).a;"
//  "\n    vec4 glow = glowColor * smoothstep(glowMin, glowMax, glowDst);"
//  "\n"
//  "\n    float mask = 1.0-alpha;"
//  "\n"
//  "\n    vec4 base = color * vec4(vec3(1.0), dst);"
//  "\n    gl_FragColor = mix(base, glow, mask);"
//  "\n}";

  GLint result = GL_FALSE;
  int info_length;

  // compile Vertex Shader
  glShaderSource(vert_shader, 1, &vert_shader_src, NULL);
  glCompileShader(vert_shader);

  // check Vertex Shader
  glGetShaderiv(vert_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(vert_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> vert_shader_errmsg(info_length+1);
    glGetShaderInfoLog(vert_shader, info_length, NULL, &vert_shader_errmsg[0]);
    printf("%s\n", &vert_shader_errmsg[0]);
  }

  // compile Fragment Shader
  glShaderSource(frag_shader, 1, &frag_shader_src, NULL);
  glCompileShader(frag_shader);

  // check Fragment Shader
  glGetShaderiv(frag_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(frag_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> frag_shader_errmsg(info_length+1);
    glGetShaderInfoLog(frag_shader, info_length, NULL, &frag_shader_errmsg[0]);
    printf("%s\n", &frag_shader_errmsg[0]);
  }

  // link the program
  GLuint program = glCreateProgram();
  glAttachShader(program, vert_shader);
  glAttachShader(program, frag_shader);
  glLinkProgram(program);

  // check the program
  glGetProgramiv(program, GL_LINK_STATUS, &result);
  glGetProgramiv(program, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> program_errmsg(info_length+1);
    glGetProgramInfoLog(program, info_length, NULL, &program_errmsg[0]);
    printf("%s\n", &program_errmsg[0]);
  }

  glDetachShader(1, vert_shader);
  glDetachShader(1, frag_shader);
  glDeleteShader(vert_shader);
  glDeleteShader(frag_shader);

  return program;
}